

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::readOp<(moira::Core)0,(moira::Mode)4,2,16448ull>
          (Moira *this,int n,u32 *ea,u32 *result)

{
  int *piVar1;
  u32 uVar2;
  
  uVar2 = computeEA<(moira::Core)0,(moira::Mode)4,2,16448ull>(this,n);
  *ea = uVar2;
  piVar1 = (int *)((long)&(this->reg).field_3 + (long)n * 4 + 0x20);
  *piVar1 = *piVar1 + -2;
  uVar2 = read<(moira::Core)0,(moira::AddrSpace)1,2,16448ull>(this,*ea);
  *result = uVar2;
  return;
}

Assistant:

void
Moira::readOp(int n, u32 *ea, u32 *result)
{
    switch (M) {

        case Mode::DN: *result = readD<S>(n);   break;
        case Mode::AN: *result = readA<S>(n);   break;
        case Mode::IM: *result = readI<C, S>(); break;

        default:

            // Compute effective address
            *ea = computeEA<C, M, S, F>(n);

            // Emulate -(An) register modification
            updateAnPD<M, S>(n);

            // Read from effective address
            *result = readM<C, M, S, F>(*ea);

            // Emulate (An)+ register modification
            updateAnPI<M, S>(n);
    }
}